

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

void freeblock(Memcontrol *mc,Header *block)

{
  size_t sVar1;
  int local_24;
  int i;
  size_t size;
  Header *block_local;
  Memcontrol *mc_local;
  
  if (block != (Header *)0x0) {
    sVar1 = (block->d).size;
    for (local_24 = 0; local_24 < 0x10; local_24 = local_24 + 1) {
      if (*(char *)((long)block + (long)local_24 + sVar1 + 0x10) != 'U') {
        __assert_fail("*(((char *)((block + 1))) + size + i) == 0x55",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x76,"void freeblock(Memcontrol *, Header *)");
      }
    }
    mc->objcount[(block->d).type] = mc->objcount[(block->d).type] - 1;
    memset(block,0xab,sVar1 + 0x20);
    free(block);
    mc->numblocks = mc->numblocks - 1;
    mc->total = mc->total - sVar1;
  }
  return;
}

Assistant:

static void freeblock (Memcontrol *mc, Header *block) {
  if (block) {
    size_t size = block->d.size;
    int i;
    for (i = 0; i < MARKSIZE; i++)  /* check marks after block */
      lua_assert(*(cast_charp(block + 1) + size + i) == MARK);
    mc->objcount[block->d.type]--;
    fillmem(block, sizeof(Header) + size + MARKSIZE);  /* erase block */
    free(block);  /* actually free block */
    mc->numblocks--;  /* update counts */
    mc->total -= size;
  }
}